

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::formatToDecimalQuantity
          (DecimalFormat *this,Formattable *number,DecimalQuantity *output,UErrorCode *status)

{
  UFormattedNumberData obj;
  UFormattedNumberData local_180;
  
  icu_63::number::impl::UFormattedNumberData::UFormattedNumberData(&local_180);
  Formattable::populateDecimalQuantity(number,&local_180.quantity,status);
  icu_63::number::LocalizedNumberFormatter::formatImpl
            ((this->fields->formatter).
             super_LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>.ptr,&local_180,
             status);
  icu_63::number::impl::DecimalQuantity::operator=(output,&local_180.quantity);
  icu_63::number::impl::UFormattedNumberData::~UFormattedNumberData(&local_180);
  return;
}

Assistant:

void DecimalFormat::formatToDecimalQuantity(const Formattable& number, DecimalQuantity& output,
                                            UErrorCode& status) const {
    UFormattedNumberData obj;
    number.populateDecimalQuantity(obj.quantity, status);
    fields->formatter->formatImpl(&obj, status);
    output = std::move(obj.quantity);
}